

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O0

string * trim(string *s)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  string *in_RSI;
  string *in_RDI;
  bool bVar4;
  string *out;
  string local_68 [32];
  string local_48 [55];
  undefined1 local_11;
  
  local_11 = 0;
  std::__cxx11::string::string(in_RDI,in_RSI);
  while( true ) {
    uVar1 = std::__cxx11::string::empty();
    bVar4 = false;
    if ((uVar1 & 1) == 0) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
      iVar2 = isspace((int)*pcVar3);
      bVar4 = iVar2 != 0;
    }
    if (!bVar4) break;
    std::__cxx11::string::substr((ulong)local_48,(ulong)in_RDI);
    std::__cxx11::string::operator=(in_RDI,local_48);
    std::__cxx11::string::~string(local_48);
  }
  while( true ) {
    uVar1 = std::__cxx11::string::empty();
    bVar4 = false;
    if ((uVar1 & 1) == 0) {
      std::__cxx11::string::size();
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
      iVar2 = isspace((int)*pcVar3);
      bVar4 = iVar2 != 0;
    }
    if (!bVar4) break;
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_68,(ulong)in_RDI);
    std::__cxx11::string::operator=(in_RDI,local_68);
    std::__cxx11::string::~string(local_68);
  }
  return in_RDI;
}

Assistant:

static std::string trim(const std::string &s)
{
    std::string out = s;
    while (not out.empty() and std::isspace(out[0])) out = out.substr(1);
    while (not out.empty() and std::isspace(out[out.size()-1])) out = out.substr(0, out.size()-1);
    return out;
}